

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
unicode_cpts_normalize_nfd
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *cpts)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  uint *puVar8;
  difference_type __d;
  ulong uVar9;
  uint32_t cpt;
  allocator_type local_2d;
  uint local_2c;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)(cpts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(cpts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_2d);
  puVar1 = (cpts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(cpts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      local_2c = puVar1[lVar4];
      puVar5 = (uint *)_ZGR18unicode_ranges_nfd_;
      uVar7 = 0x724;
      do {
        uVar9 = uVar7 >> 1;
        uVar6 = ~uVar9 + uVar7;
        uVar7 = uVar9;
        if (puVar5[uVar9 * 3] <= local_2c) {
          puVar5 = puVar5 + uVar9 * 3 + 3;
          uVar7 = uVar6;
        }
      } while (0 < (long)uVar7);
      puVar8 = &local_2c;
      if ((puVar5[-3] <= local_2c) && (puVar8 = puVar5 + -1, puVar5[-2] < local_2c)) {
        puVar8 = &local_2c;
      }
      puVar2[lVar4] = *puVar8;
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar3 + (ulong)(lVar3 == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> unicode_cpts_normalize_nfd(const std::vector<uint32_t> & cpts) {
    auto comp = [] (const uint32_t cpt, const range_nfd & range) {
        return cpt < range.first;
    };
    std::vector<uint32_t> result(cpts.size());
    for (size_t i = 0; i < cpts.size(); ++i) {
        const uint32_t cpt = cpts[i];
        auto it = std::upper_bound(unicode_ranges_nfd.begin(), unicode_ranges_nfd.end(), cpt, comp) - 1;
        result[i] = (it->first <= cpt && cpt <= it->last) ? it->nfd : cpt;
    }
    return result;
}